

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_set_compression_pref(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  int nkeys;
  fitsfile *local_130;
  long local_128 [7];
  int naxis;
  char value [71];
  LONGLONG dataend;
  LONGLONG datastart;
  char card [81];
  
  local_128[0] = 1;
  local_128[1] = 1;
  local_128[2] = 1;
  local_128[3] = 1;
  local_128[4] = 1;
  local_128[5] = 1;
  iVar6 = *status;
  if (iVar6 < 1) {
    ffghadll(infptr,(LONGLONG *)0x0,&datastart,&dataend,status);
    if (0xffffffff < dataend - datastart) {
      outfptr->Fptr->request_huge_hdu = 1;
    }
    local_130 = infptr;
    ffghsp(infptr,&nkeys,(int *)0x0,status);
    for (iVar6 = 2; pcVar5 = card + 2, iVar6 <= nkeys; iVar6 = iVar6 + 1) {
      ffgrec(local_130,iVar6,card,status);
      if (card._0_2_ == 0x5a46) {
        ffpsvc(card,value,(char *)0x0,status);
        iVar2 = bcmp(pcVar5,"ALGOR",5);
        if (iVar2 == 0) {
          iVar3 = fits_strncasecmp(value,"\'RICE_1",7);
          iVar2 = 0xb;
          if (iVar3 != 0) {
            iVar3 = fits_strncasecmp(value,"\'GZIP_1",7);
            iVar2 = 0x15;
            if (iVar3 != 0) {
              iVar3 = fits_strncasecmp(value,"\'GZIP_2",7);
              iVar2 = 0x16;
              if (iVar3 != 0) {
                iVar3 = fits_strncasecmp(value,"\'PLIO_1",7);
                iVar2 = 0x1f;
                if (iVar3 != 0) {
                  iVar3 = fits_strncasecmp(value,"\'HCOMPRESS_1",0xc);
                  iVar2 = 0x29;
                  if (iVar3 != 0) {
                    iVar3 = fits_strncasecmp(value,"\'NONE",5);
                    iVar2 = -1;
                    if (iVar3 != 0) {
                      pcVar5 = "Unknown FZALGOR keyword compression algorithm:";
                      goto LAB_00174abe;
                    }
                  }
                }
              }
            }
          }
          fits_set_compression_type(outfptr,iVar2,status);
        }
        else {
          iVar2 = bcmp(pcVar5,"TILE  ",6);
          if (iVar2 == 0) {
            iVar2 = fits_strncasecmp(value,"\'row",4);
            if (iVar2 == 0) {
              local_128[0] = -1;
            }
            else {
              iVar2 = fits_strncasecmp(value,"\'whole",6);
              if (iVar2 == 0) {
                local_128[0] = -1;
                local_128[1] = 0xffffffffffffffff;
                local_128[2] = 0xffffffffffffffff;
              }
              else {
                ffdtdm(local_130,value,0,6,&naxis,local_128,status);
              }
            }
            fits_set_tile_dim(outfptr,6,local_128,status);
          }
          else {
            iVar2 = bcmp(pcVar5,"QVALUE",6);
            if (iVar2 == 0) {
              dVar1 = atof(value);
              uVar7 = -(uint)((float)dVar1 == 0.0);
              outfptr->Fptr->request_quantize_level =
                   (float)(~uVar7 & (uint)(float)dVar1 | uVar7 & 0x461c3c00);
            }
            else {
              iVar2 = bcmp(pcVar5,"QMETHD",6);
              if (iVar2 == 0) {
                iVar3 = fits_strncasecmp(value,"\'no_dither",10);
                iVar2 = -1;
                if (iVar3 != 0) {
                  iVar3 = fits_strncasecmp(value,"\'subtractive_dither_1",0x15);
                  iVar2 = 1;
                  if (iVar3 != 0) {
                    iVar3 = fits_strncasecmp(value,"\'subtractive_dither_2",0x15);
                    iVar2 = 2;
                    if (iVar3 != 0) {
                      pcVar5 = "Unknown value for FZQUANT keyword: (set_compression_pref)";
LAB_00174abe:
                      ffpmsg(pcVar5);
                      ffpmsg(value);
                      *status = 0x19d;
                      return 0x19d;
                    }
                  }
                }
                fits_set_quantize_method(outfptr,iVar2,status);
              }
              else {
                iVar2 = bcmp(pcVar5,"DTHRSD",6);
                if (iVar2 == 0) {
                  iVar3 = fits_strncasecmp(value,"\'checksum",9);
                  iVar2 = -1;
                  if (iVar3 != 0) {
                    iVar2 = fits_strncasecmp(value,"\'clock",6);
                    if (iVar2 == 0) {
                      iVar2 = 0;
                    }
                    else {
                      lVar4 = atol(value + (value[0] == '\''));
                      iVar2 = (int)lVar4;
                      if (iVar2 - 0x2711U < 0xffffd8f0) {
                        ffpmsg("Invalid value for FZDTHRSD keyword: (set_compression_pref)");
                        ffpmsg(value);
                        *status = 0x19d;
                        return 0x19d;
                      }
                    }
                  }
                  fits_set_dither_seed(outfptr,iVar2,status);
                }
                else {
                  iVar2 = bcmp(pcVar5,"I2F",3);
                  if (iVar2 == 0) {
                    iVar2 = fits_strcasecmp(value,"t");
                    if (iVar2 == 0) {
                      outfptr->Fptr->request_lossy_int_compress = 1;
                    }
                    else {
                      iVar2 = fits_strcasecmp(value,"f");
                      if (iVar2 != 0) {
                        pcVar5 = "Unknown value for FZI2F keyword: (set_compression_pref)";
                        goto LAB_00174abe;
                      }
                      outfptr->Fptr->request_lossy_int_compress = 0;
                    }
                  }
                  else {
                    iVar2 = bcmp(pcVar5,"HSCALE ",6);
                    if (iVar2 == 0) {
                      dVar1 = atof(value);
                      outfptr->Fptr->request_hcomp_scale = (float)dVar1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar6 = *status;
  }
  return iVar6;
}

Assistant:

int fits_set_compression_pref(
      fitsfile *infptr,
      fitsfile *outfptr,
      int *status) 
{
/*
   Set the preference for various compression options, based
   on keywords in the input file that
   provide guidance about how the HDU should be compressed when written
   to the output file.
*/

    int ii, naxis, nkeys, comptype;
    int  ivalue;
    long tiledim[6]= {1,1,1,1,1,1};
    char card[FLEN_CARD], value[FLEN_VALUE];
    double  qvalue;
    float hscale;
    LONGLONG datastart, dataend; 
    if (*status > 0)
        return(*status);

    /* check the size of the HDU that is to be compressed */
    fits_get_hduaddrll(infptr, NULL, &datastart, &dataend, status);
    if ( (LONGLONG)(dataend - datastart) > UINT32_MAX) {
       /* use 64-bit '1Q' variable length columns instead of '1P' columns */
       /* for large files, in case the heap size becomes larger than 2**32 bytes*/
       fits_set_huge_hdu(outfptr, 1, status);
    }

    fits_get_hdrspace(infptr, &nkeys, NULL, status);
 
   /* look for a image compression directive keywords (begin with 'FZ') */
    for (ii = 2; ii <= nkeys; ii++) {
        
	fits_read_record(infptr, ii, card, status);

	if (!strncmp(card, "FZ", 2) ){
	
            /* get the keyword value string */
            fits_parse_value(card, value, NULL, status);
	    
	    if      (!strncmp(card+2, "ALGOR", 5) ) {

	        /* set the desired compression algorithm */
                /* allowed values: RICE_1, GZIP_1, GZIP_2, PLIO_1,     */
                /*  HCOMPRESS_1, BZIP2_1, and NOCOMPRESS               */

                if        (!fits_strncasecmp(value, "'RICE_1", 7) ) {
		    comptype = RICE_1;
                } else if (!fits_strncasecmp(value, "'GZIP_1", 7) ) {
		    comptype = GZIP_1;
                } else if (!fits_strncasecmp(value, "'GZIP_2", 7) ) {
		    comptype = GZIP_2;
                } else if (!fits_strncasecmp(value, "'PLIO_1", 7) ) {
		    comptype = PLIO_1;
                } else if (!fits_strncasecmp(value, "'HCOMPRESS_1", 12) ) {
		    comptype = HCOMPRESS_1;
                } else if (!fits_strncasecmp(value, "'NONE", 5) ) {
		    comptype = NOCOMPRESS;
		} else {
			ffpmsg("Unknown FZALGOR keyword compression algorithm:");
			ffpmsg(value);
			return(*status = DATA_COMPRESSION_ERR);
		}  

	        fits_set_compression_type (outfptr, comptype, status);

	    } else if (!strncmp(card+2, "TILE  ", 6) ) {

                if (!fits_strncasecmp(value, "'row", 4) ) {
                   tiledim[0] = -1;
		} else if (!fits_strncasecmp(value, "'whole", 6) ) {
                   tiledim[0] = -1;
                   tiledim[1] = -1;
                   tiledim[2] = -1;
                } else {
		   ffdtdm(infptr, value, 0,6, &naxis, tiledim, status);
                }

	        /* set the desired tile size */
		fits_set_tile_dim (outfptr, 6, tiledim, status);

	    } else if (!strncmp(card+2, "QVALUE", 6) ) {

	        /* set the desired Q quantization value */
		qvalue = atof(value);
		fits_set_quantize_level (outfptr, (float) qvalue, status);

	    } else if (!strncmp(card+2, "QMETHD", 6) ) {

                    if (!fits_strncasecmp(value, "'no_dither", 10) ) {
                        ivalue = -1; /* just quantize, with no dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_1", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_1; /* use subtractive dithering */
		    } else if (!fits_strncasecmp(value, "'subtractive_dither_2", 21) ) {
                        ivalue = SUBTRACTIVE_DITHER_2; /* dither, except preserve zero-valued pixels */
		    } else {
		        ffpmsg("Unknown value for FZQUANT keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
		    }

		    fits_set_quantize_method(outfptr, ivalue, status);
		    
	    } else if (!strncmp(card+2, "DTHRSD", 6) ) {

                if (!fits_strncasecmp(value, "'checksum", 9) ) {
                    ivalue = -1; /* use checksum of first tile */
		} else if (!fits_strncasecmp(value, "'clock", 6) ) {
                    ivalue = 0; /* set dithering seed based on system clock */
		} else {  /* read integer value */
		    if (*value == '\'')
                        ivalue = (int) atol(value+1); /* allow for leading quote character */
                    else 
                        ivalue = (int) atol(value); 

                    if (ivalue < 1 || ivalue > 10000) {
		        ffpmsg("Invalid value for FZDTHRSD keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                    }
		}

	        /* set the desired dithering */
		fits_set_dither_seed(outfptr, ivalue, status);

	    } else if (!strncmp(card+2, "I2F", 3) ) {

	        /* set whether to convert integers to float then use lossy compression */
                if (!fits_strcasecmp(value, "t") ) {
		    fits_set_lossy_int (outfptr, 1, status);
		} else if (!fits_strcasecmp(value, "f") ) {
		    fits_set_lossy_int (outfptr, 0, status);
		} else {
		        ffpmsg("Unknown value for FZI2F keyword: (set_compression_pref)");
			ffpmsg(value);
                        return(*status = DATA_COMPRESSION_ERR);
                }

	    } else if (!strncmp(card+2, "HSCALE ", 6) ) {

	        /* set the desired Hcompress scale value */
		hscale = (float) atof(value);
		fits_set_hcomp_scale (outfptr, hscale, status);
            }
	}    
    }
    return(*status);
}